

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-tests.cpp
# Opt level: O1

void __thiscall ComplexClass::~ComplexClass(ComplexClass *this)

{
  ClassWithMemAllocations *this_00;
  LibClass *this_01;
  
  if (this->m_MemberArr1 != (SimpleStruct *)0x0) {
    operator_delete__(this->m_MemberArr1);
  }
  if (this->m_MemberPtr2 != (SimpleClass *)0x0) {
    operator_delete(this->m_MemberPtr2,8);
  }
  this_00 = this->m_MemberPtr3;
  if (this_00 != (ClassWithMemAllocations *)0x0) {
    ClassWithMemAllocations::~ClassWithMemAllocations(this_00);
    operator_delete(this_00,0x18);
  }
  this_01 = this->m_MemberPtr4;
  if (this_01 != (LibClass *)0x0) {
    LibClass::~LibClass(this_01);
    operator_delete(this_01,0x50);
    return;
  }
  return;
}

Assistant:

~ComplexClass() {
        delete [] m_MemberArr1;
        delete m_MemberPtr2;
        delete m_MemberPtr3;
        delete m_MemberPtr4;
    }